

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPulley.cpp
# Opt level: O3

void __thiscall chrono::ChLinkPulley::UpdateTime(ChLinkPulley *this,double mytime)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  ulong uVar9;
  undefined8 uVar10;
  byte bVar11;
  undefined1 auVar12 [16];
  ulong uVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint uVar23;
  ChQuaternion<double> *pCVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  double dVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  double dVar79;
  double dVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  double m20;
  double m12;
  double m10;
  double m02;
  double m01;
  double m21;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [56];
  double local_1e0;
  Coordsys local_1d8;
  double local_198;
  undefined8 uStack_190;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  Vector local_168;
  double local_148;
  ChFrame<double> local_138;
  ChFrame<double> local_b0;
  undefined1 auVar28 [16];
  undefined1 extraout_var [56];
  
  ChLinkLockLock::UpdateTime(&this->super_ChLinkLockLock,mytime);
  local_138._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_138.coord.pos.m_data[0] = 0.0;
  local_138.coord.pos.m_data[1] = 0.0;
  local_138.coord.pos.m_data[2] = 0.0;
  local_b0._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_b0.coord.pos.m_data[0] = 0.0;
  local_b0.coord.pos.m_data[1] = 0.0;
  local_b0.coord.pos.m_data[2] = 0.0;
  local_b0.coord.rot.m_data[0] = 1.0;
  local_b0.coord.rot.m_data[1] = 0.0;
  local_b0.coord.rot.m_data[2] = 0.0;
  local_b0.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_b0.Amatrix,(ChQuaternion<double> *)&local_138);
  local_138._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_138.coord.pos.m_data[2] = 0.0;
  local_1d8.pos.m_data[0] = 1.0;
  local_138.coord.pos.m_data[0] = 0.0;
  local_138.coord.pos.m_data[1] = 0.0;
  local_138.coord.rot.m_data[0] = 1.0;
  local_1d8.pos.m_data[1] = 0.0;
  local_1d8.pos.m_data[2] = 0.0;
  local_1d8.rot.m_data[0] = 0.0;
  local_138.coord.rot.m_data[1] = 0.0;
  local_138.coord.rot.m_data[2] = 0.0;
  local_138.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_138.Amatrix,(ChQuaternion<double> *)&local_1d8);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)
             (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body1,
             &this->local_shaft1,&local_b0);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)
             (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body2,
             &this->local_shaft2,&local_138);
  Get_shaft_pos2(&local_1d8.pos,this);
  Get_shaft_pos1(&local_168,this);
  auVar7._8_8_ = local_1d8.pos.m_data[1];
  auVar7._0_8_ = local_1d8.pos.m_data[0];
  auVar19._8_8_ =
       local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar19._0_8_ =
       local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar17._8_8_ =
       local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar17._0_8_ =
       local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar20._8_8_ =
       local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar20._0_8_ =
       local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar18._8_8_ =
       local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar18._0_8_ =
       local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar22._8_8_ =
       local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar22._0_8_ =
       local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar26._8_8_ = local_168.m_data[1];
  auVar26._0_8_ = local_168.m_data[0];
  auVar7 = vsubpd_avx(auVar7,auVar26);
  auVar27 = vmovhpd_avx(auVar19,local_b0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[3]);
  auVar4 = vmovhpd_avx(auVar17,local_b0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[0]);
  auVar5 = vmovhpd_avx(auVar18,local_b0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[1]);
  local_238._0_8_ = local_1d8.pos.m_data[2] - local_168.m_data[2];
  auVar21._8_8_ =
       local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar21._0_8_ =
       local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar6 = vshufpd_avx(auVar7,auVar7,3);
  auVar85._0_8_ = auVar7._0_8_;
  auVar85._8_8_ = auVar85._0_8_;
  auVar69._0_8_ = auVar6._0_8_ * auVar27._0_8_;
  auVar69._8_8_ = auVar6._8_8_ * auVar27._8_8_;
  local_238._8_8_ = 0;
  auVar4 = vfmadd213pd_fma(auVar4,auVar85,auVar69);
  auVar27 = vmovhpd_avx(auVar21,local_b0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[6]);
  auVar38._8_8_ = local_238._0_8_;
  auVar38._0_8_ = local_238._0_8_;
  auVar26 = vfmadd213pd_fma(auVar27,auVar38,auVar4);
  auVar27 = vmovhpd_avx(auVar20,local_b0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[4]);
  auVar4 = vmovhpd_avx(auVar22,local_b0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[7]);
  auVar57._0_8_ = auVar6._0_8_ * auVar27._0_8_;
  auVar57._8_8_ = auVar6._8_8_ * auVar27._8_8_;
  auVar5 = vfmadd213pd_fma(auVar5,auVar85,auVar57);
  auVar27 = vshufpd_avx(auVar26,auVar26,1);
  auVar4 = vfmadd213pd_fma(auVar4,auVar38,auVar5);
  dVar36 = auVar4._0_8_;
  auVar39._0_8_ = dVar36 * dVar36;
  auVar39._8_8_ = auVar4._8_8_ * auVar4._8_8_;
  auVar4 = vshufpd_avx(auVar4,auVar4,1);
  auVar5 = vfmadd231pd_fma(auVar39,auVar26,auVar26);
  auVar6 = vsqrtpd_avx(auVar5);
  auVar5._8_8_ = 0x10000000000000;
  auVar5._0_8_ = 0x10000000000000;
  uVar9 = vcmppd_avx512vl(auVar6,auVar5,5);
  auVar5 = vshufpd_avx(auVar6,auVar6,1);
  dVar60 = 1.0 / auVar6._0_8_;
  dVar35 = 1.0 / auVar5._0_8_;
  uVar13 = (uVar9 & 3) >> 1;
  bVar11 = (byte)(uVar9 & 3);
  dVar35 = ChAtan2((double)(uVar13 * (long)(auVar27._0_8_ * dVar35) +
                           (ulong)!SUB81(uVar13,0) * 0x3ff0000000000000),
                   (double)(uVar13 * (long)(auVar4._0_8_ * dVar35)));
  auVar56._0_8_ =
       ChAtan2((double)((ulong)(bVar11 & 1) * (long)(auVar26._0_8_ * dVar60) +
                       (ulong)!(bool)(bVar11 & 1) * 0x3ff0000000000000),
               (double)((ulong)(bVar11 & 1) * (long)(dVar36 * dVar60)));
  auVar56._8_56_ = extraout_var;
  auVar27._0_8_ = this->a1;
  auVar27._8_8_ = this->a2;
  auVar61._8_8_ = 0x401921fb54442d18;
  auVar61._0_8_ = 0x401921fb54442d18;
  auVar6._8_8_ = extraout_XMM0_Qb;
  auVar6._0_8_ = dVar35;
  auVar81._8_8_ = 0x7fffffffffffffff;
  auVar81._0_8_ = 0x7fffffffffffffff;
  auVar4 = vdivpd_avx(auVar27,auVar61);
  auVar5 = vunpcklpd_avx(auVar6,auVar56._0_16_);
  auVar4 = vroundpd_avx(auVar4,9);
  auVar6 = vfmadd231pd_fma(auVar5,auVar61,auVar4);
  auVar40._0_8_ = auVar6._0_8_ + 6.283185307179586;
  auVar40._8_8_ = auVar6._8_8_ + 6.283185307179586;
  auVar4._8_8_ = 0xc01921fb54442d18;
  auVar4._0_8_ = 0xc01921fb54442d18;
  auVar26 = vaddpd_avx512vl(auVar6,auVar4);
  auVar4 = vsubpd_avx(auVar40,auVar27);
  auVar5 = vsubpd_avx(auVar6,auVar27);
  auVar27 = vandpd_avx(auVar4,auVar81);
  auVar4 = vandpd_avx(auVar5,auVar81);
  uVar9 = vcmppd_avx512vl(auVar27,auVar4,1);
  auVar27 = vblendmpd_avx512vl(auVar6,auVar40);
  bVar3 = (bool)((byte)(uVar9 & 3) & 1);
  auVar28._0_8_ = (ulong)bVar3 * auVar27._0_8_ | (ulong)!bVar3 * (long)auVar40._0_8_;
  uVar9 = (uVar9 & 3) >> 1;
  auVar28._8_8_ = uVar9 * auVar27._8_8_ | (ulong)!SUB81(uVar9,0) * (long)auVar40._8_8_;
  auVar27 = vsubpd_avx(auVar26,auVar28);
  auVar4 = vsubpd_avx(auVar6,auVar28);
  auVar27 = vandpd_avx(auVar27,auVar81);
  auVar4 = vandpd_avx(auVar4,auVar81);
  uVar9 = vcmppd_avx512vl(auVar27,auVar4,1);
  local_1e0 = 0.0;
  bVar3 = (bool)((byte)(uVar9 & 3) & 1);
  auVar29._0_8_ = (double)((ulong)bVar3 * auVar26._0_8_ | !bVar3 * auVar28._0_8_);
  uVar9 = (uVar9 & 3) >> 1;
  auVar29._8_8_ = uVar9 * auVar26._8_8_ | !SUB81(uVar9,0) * auVar28._8_8_;
  this->a1 = auVar29._0_8_;
  this->a2 = (double)auVar29._8_8_;
  if (this->checkphase != false) {
    auVar27 = vshufpd_avx(auVar29,auVar29,1);
    dVar36 = (auVar29._0_8_ - this->phase) - auVar27._0_8_ / this->tau;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar36;
    uVar10 = vcmpsd_avx512f(auVar41,ZEXT816(0x400921fb54442d18),0xe);
    bVar3 = (bool)((byte)uVar10 & 1);
    auVar30._0_8_ =
         (ulong)bVar3 * (long)(dVar36 + -6.283185307179586) + (ulong)!bVar3 * (long)dVar36;
    auVar30._8_8_ = 0;
    auVar27 = vminsd_avx(ZEXT816(0x3fe921fb54442d18),auVar30);
    auVar27 = vmaxsd_avx(ZEXT816(0xbfe921fb54442d18),auVar27);
    local_1e0 = auVar27._0_8_;
  }
  Get_shaft_dir1(&local_1d8.pos,this);
  Get_shaft_dir1(&local_168,this);
  auVar27 = vshufpd_avx(auVar7,auVar7,1);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_168.m_data[0];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = auVar27._0_8_ * local_168.m_data[1];
  auVar27 = vfmadd231sd_fma(auVar42,auVar7,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_168.m_data[2];
  auVar27 = vfmadd231sd_fma(auVar27,local_238,auVar2);
  dVar36 = auVar27._0_8_;
  auVar43._0_8_ = dVar36 * local_1d8.pos.m_data[0];
  auVar43._8_8_ = dVar36 * local_1d8.pos.m_data[1];
  local_238._0_8_ = (double)local_238._0_8_ - dVar36 * local_1d8.pos.m_data[2];
  local_178 = vsubpd_avx(auVar7,auVar43);
  auVar44._0_8_ = local_178._0_8_ * local_178._0_8_;
  auVar44._8_8_ = local_178._8_8_ * local_178._8_8_;
  auVar27 = vshufpd_avx(auVar44,auVar44,1);
  auVar27 = vfmadd231sd_fma(auVar27,local_178,local_178);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = local_238._0_8_;
  auVar27 = vfmadd231sd_fma(auVar27,auVar70,auVar70);
  auVar27 = vsqrtsd_avx(auVar27,auVar27);
  dVar36 = auVar27._0_8_;
  this->shaft_dist = dVar36;
  uVar23 = 0xff;
  if (dVar36 < 2.2250738585072014e-308) {
    uVar23 = 0;
  }
  dVar35 = 1.0 / dVar36;
  auVar62._8_8_ = dVar35;
  auVar62._0_8_ = dVar35;
  auVar27 = vmulpd_avx512vl(local_178,auVar62);
  bVar3 = (bool)((byte)uVar23 & 1);
  local_228._0_8_ = (ulong)bVar3 * auVar27._0_8_ | (ulong)!bVar3 * 0x3ff0000000000000;
  local_228._8_8_ = (ulong)((byte)(uVar23 >> 1) & 1) * auVar27._8_8_;
  local_248._0_8_ =
       (ulong)(2.2250738585072014e-308 <= dVar36) * (long)((double)local_238._0_8_ * dVar35);
  local_248._8_8_ = 0;
  Get_shaft_dir1(&local_1d8.pos,this);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = local_1d8.pos.m_data[0];
  auVar63._8_8_ = local_1d8.pos.m_data[2];
  auVar63._0_8_ = local_1d8.pos.m_data[2];
  auVar16._8_8_ = local_1d8.pos.m_data[2];
  auVar16._0_8_ = local_1d8.pos.m_data[1];
  auVar5 = vunpcklpd_avx(auVar63,auVar58);
  auVar27 = vshufpd_avx(local_228,local_248,1);
  auVar4 = vshufpd_avx(local_228,local_228,1);
  auVar64._0_8_ = auVar27._0_8_ * auVar5._0_8_;
  auVar64._8_8_ = auVar27._8_8_ * auVar5._8_8_;
  auVar27 = vunpcklpd_avx(local_248,local_228);
  local_188 = vfmsub213pd_fma(auVar27,auVar16,auVar64);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = (double)local_228._0_8_ * local_1d8.pos.m_data[1];
  auVar27 = vfmsub231sd_fma(auVar45,auVar58,auVar4);
  local_198 = auVar27._0_8_;
  dVar36 = acos((this->r1 - this->r2) / this->shaft_dist);
  dVar60 = cos(dVar36);
  dVar37 = sin(dVar36);
  dVar35 = dVar37 * local_198 + dVar60 * (double)local_248._0_8_;
  local_218._0_8_ = dVar37 * (double)local_188._0_8_ + dVar60 * (double)local_228._0_8_;
  local_218._8_8_ = dVar37 * (double)local_188._8_8_ + dVar60 * (double)local_228._8_8_;
  local_148 = cos(dVar36);
  local_248._0_8_ = local_148 * (double)local_248._0_8_;
  dVar60 = sin(dVar36);
  local_248._0_8_ = (double)local_248._0_8_ - dVar60 * local_198;
  Get_shaft_pos1(&local_1d8.pos,this);
  dVar36 = this->r1;
  (this->belt_up1).m_data[0] = dVar36 * (double)local_218._0_8_ + local_1d8.pos.m_data[0];
  (this->belt_up1).m_data[1] = dVar36 * (double)local_218._8_8_ + local_1d8.pos.m_data[1];
  (this->belt_up1).m_data[2] = dVar36 * dVar35 + local_1d8.pos.m_data[2];
  Get_shaft_pos1(&local_1d8.pos,this);
  dVar36 = this->r1;
  auVar65._0_8_ = local_148 * (double)local_228._0_8_;
  auVar65._8_8_ = local_148 * (double)local_228._8_8_;
  auVar71._0_8_ = dVar60 * (double)local_188._0_8_;
  auVar71._8_8_ = dVar60 * (double)local_188._8_8_;
  auVar27 = vsubpd_avx(auVar65,auVar71);
  (this->belt_low1).m_data[0] = auVar27._0_8_ * dVar36 + local_1d8.pos.m_data[0];
  (this->belt_low1).m_data[1] = auVar27._8_8_ * dVar36 + local_1d8.pos.m_data[1];
  (this->belt_low1).m_data[2] = dVar36 * (double)local_248._0_8_ + local_1d8.pos.m_data[2];
  Get_shaft_pos1(&local_1d8.pos,this);
  dVar36 = this->r2;
  (this->belt_up2).m_data[0] =
       dVar36 * (double)local_218._0_8_ + (double)local_178._0_8_ + local_1d8.pos.m_data[0];
  (this->belt_up2).m_data[1] =
       dVar36 * (double)local_218._8_8_ + (double)local_178._8_8_ + local_1d8.pos.m_data[1];
  (this->belt_up2).m_data[2] = (double)local_238._0_8_ + local_1d8.pos.m_data[2] + dVar36 * dVar35;
  Get_shaft_pos1(&local_1d8.pos,this);
  dVar36 = this->r2;
  (this->belt_low2).m_data[0] =
       dVar36 * auVar27._0_8_ + (double)local_178._0_8_ + local_1d8.pos.m_data[0];
  (this->belt_low2).m_data[1] =
       dVar36 * auVar27._8_8_ + (double)local_178._8_8_ + local_1d8.pos.m_data[1];
  (this->belt_low2).m_data[2] =
       (double)local_238._0_8_ + local_1d8.pos.m_data[2] + dVar36 * (double)local_248._0_8_;
  dVar14 = (this->belt_up1).m_data[0];
  dVar15 = (this->belt_up1).m_data[1];
  dVar60 = (this->belt_up2).m_data[1] - (this->belt_up1).m_data[1];
  dVar37 = (this->belt_up2).m_data[0] - dVar14;
  dVar36 = (this->belt_up1).m_data[2];
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar37;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar60 * dVar60;
  auVar27 = vfmadd231sd_fma(auVar82,auVar72,auVar72);
  dVar8 = (this->belt_up2).m_data[2] - dVar36;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar8;
  auVar27 = vfmadd231sd_fma(auVar27,auVar75,auVar75);
  auVar27 = vsqrtsd_avx(auVar27,auVar27);
  dVar79 = 1.0 / auVar27._0_8_;
  bVar3 = 2.2250738585072014e-308 <= auVar27._0_8_;
  dVar8 = (double)((ulong)bVar3 * (long)(dVar8 * dVar79));
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar8;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar35;
  dVar60 = (double)((ulong)bVar3 * (long)(dVar60 * dVar79));
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar60;
  local_178._0_8_ = (ulong)bVar3 * (long)(dVar37 * dVar79) + (ulong)!bVar3 * 0x3ff0000000000000;
  local_178._8_8_ = 0;
  auVar27 = vshufpd_avx(local_218._0_16_,local_218._0_16_,1);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = auVar27._0_8_ * dVar8;
  auVar4 = vfmsub231sd_fma(auVar73,auVar32,auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = (double)local_178._0_8_ * dVar35;
  auVar5 = vfmsub231sd_fma(auVar77,auVar31,local_218._0_16_);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = (double)local_218._0_8_ * dVar60;
  auVar6 = vfmsub231sd_fma(auVar83,local_178,auVar27);
  dVar79 = auVar5._0_8_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar79 * dVar79;
  auVar27 = vfmadd231sd_fma(auVar66,auVar4,auVar4);
  auVar27 = vfmadd231sd_fma(auVar27,auVar6,auVar6);
  auVar27 = vsqrtsd_avx(auVar27,auVar27);
  dVar37 = 1.0 / auVar27._0_8_;
  bVar3 = 2.2250738585072014e-308 <= auVar27._0_8_;
  auVar33._0_8_ =
       (double)((ulong)bVar3 * (long)(auVar4._0_8_ * dVar37) + (ulong)!bVar3 * 0x3ff0000000000000);
  auVar33._8_8_ = 0;
  dVar35 = (double)((ulong)bVar3 * (long)(auVar6._0_8_ * dVar37));
  local_188._8_8_ = 0;
  local_188._0_8_ = dVar35;
  dVar37 = (double)((ulong)bVar3 * (long)(dVar79 * dVar37));
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar37;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = auVar33._0_8_ * dVar8;
  auVar27 = vfmsub231sd_fma(auVar74,local_178,local_188);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar35 * dVar60;
  auVar4 = vfmsub231sd_fma(auVar67,auVar34,auVar31);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = (double)local_178._0_8_ * dVar37;
  auVar5 = vfmsub231sd_fma(auVar78,auVar33,auVar32);
  dVar79 = auVar27._0_8_;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar79 * dVar79;
  auVar27 = vfmadd231sd_fma(auVar84,auVar4,auVar4);
  auVar27 = vfmadd231sd_fma(auVar27,auVar5,auVar5);
  auVar27 = vsqrtsd_avx(auVar27,auVar27);
  dVar80 = 1.0 / auVar27._0_8_;
  bVar3 = 2.2250738585072014e-308 <= auVar27._0_8_;
  ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2)->motion_type =
       M_MOTION_EXTERNAL;
  dVar25 = (double)((ulong)bVar3 * (long)(auVar4._0_8_ * dVar80) +
                   (ulong)!bVar3 * 0x3ff0000000000000);
  local_198 = (double)((ulong)bVar3 * (long)(dVar79 * dVar80));
  dVar79 = (double)((ulong)bVar3 * (long)(auVar5._0_8_ * dVar80));
  ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker1)->motion_type =
       M_MOTION_EXTERNAL;
  local_1d8.pos.m_data[2] = 0.0;
  local_1d8.pos.m_data[0] = 0.0;
  local_1d8.pos.m_data[1] = 0.0;
  if ((Coordsys *)&this->belt_up1 != &local_1d8) {
    local_1d8.pos.m_data[0] = dVar14;
    local_1d8.pos.m_data[1] = dVar15;
    local_1d8.pos.m_data[2] = dVar36;
  }
  uStack_190 = 0;
  local_148 = dVar35 + (double)local_178._0_8_ + local_198;
  if (0.0 <= local_148) {
    dVar36 = local_148 + 1.0;
    if (dVar36 < 0.0) {
      local_1d8.rot.m_data[3] = sqrt(dVar36);
    }
    else {
      auVar47._8_8_ = 0;
      auVar47._0_8_ = dVar36;
      auVar27 = vsqrtsd_avx(auVar47,auVar47);
      local_1d8.rot.m_data[3] = auVar27._0_8_;
    }
    local_1d8.rot.m_data[0] = local_1d8.rot.m_data[3] * 0.5;
    local_1d8.rot.m_data[3] = 0.5 / local_1d8.rot.m_data[3];
    local_1d8.rot.m_data[1] = (dVar79 - dVar37) * local_1d8.rot.m_data[3];
    local_1d8.rot.m_data[2] = (auVar33._0_8_ - dVar8) * local_1d8.rot.m_data[3];
    local_1d8.rot.m_data[3] = (dVar60 - dVar25) * local_1d8.rot.m_data[3];
  }
  else {
    if (local_198 <= (double)local_178._0_8_) {
      if ((double)local_178._0_8_ < dVar35) goto LAB_00596dcc;
      dVar36 = (((double)local_178._0_8_ - local_198) - dVar35) + 1.0;
      if (dVar36 < 0.0) {
        dVar36 = sqrt(dVar36);
      }
      else {
        auVar49._8_8_ = 0;
        auVar49._0_8_ = dVar36;
        auVar27 = vsqrtsd_avx(auVar49,auVar49);
        dVar36 = auVar27._0_8_;
      }
      local_1d8.rot.m_data[0] = dVar79 - dVar37;
      local_1d8.rot.m_data[1] = dVar36 * 0.5;
      dVar36 = 0.5 / dVar36;
      local_1d8.rot.m_data[2] = (dVar60 + dVar25) * dVar36;
      local_1d8.rot.m_data[3] = (auVar33._0_8_ + dVar8) * dVar36;
    }
    else if (local_198 < dVar35) {
LAB_00596dcc:
      dVar36 = ((dVar35 - (double)local_178._0_8_) - local_198) + 1.0;
      if (dVar36 < 0.0) {
        dVar36 = sqrt(dVar36);
      }
      else {
        auVar48._8_8_ = 0;
        auVar48._0_8_ = dVar36;
        auVar27 = vsqrtsd_avx(auVar48,auVar48);
        dVar36 = auVar27._0_8_;
      }
      local_1d8.rot.m_data[0] = dVar60 - dVar25;
      local_1d8.rot.m_data[3] = dVar36 * 0.5;
      dVar36 = 0.5 / dVar36;
      local_1d8.rot.m_data[1] = (auVar33._0_8_ + dVar8) * dVar36;
      local_1d8.rot.m_data[2] = (dVar37 + dVar79) * dVar36;
    }
    else {
      dVar36 = ((local_198 - dVar35) - (double)local_178._0_8_) + 1.0;
      if (dVar36 < 0.0) {
        dVar36 = sqrt(dVar36);
      }
      else {
        auVar46._8_8_ = 0;
        auVar46._0_8_ = dVar36;
        auVar27 = vsqrtsd_avx(auVar46,auVar46);
        dVar36 = auVar27._0_8_;
      }
      local_1d8.rot.m_data[0] = auVar33._0_8_ - dVar8;
      local_1d8.rot.m_data[2] = dVar36 * 0.5;
      dVar36 = 0.5 / dVar36;
      local_1d8.rot.m_data[3] = (dVar37 + dVar79) * dVar36;
      local_1d8.rot.m_data[1] = (dVar60 + dVar25) * dVar36;
    }
    local_1d8.rot.m_data[0] = local_1d8.rot.m_data[0] * dVar36;
  }
  ChMarker::Impose_Abs_Coord
            ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker1,&local_1d8);
  if ((Coordsys *)&this->belt_up2 != &local_1d8) {
    local_1d8.pos.m_data[0] = (this->belt_up2).m_data[0];
    local_1d8.pos.m_data[1] = (this->belt_up2).m_data[1];
    local_1d8.pos.m_data[2] = (this->belt_up2).m_data[2];
  }
  if (0.0 <= local_148) {
    dVar36 = local_148 + 1.0;
    if (dVar36 < 0.0) {
      local_1d8.rot.m_data[3] = sqrt(dVar36);
    }
    else {
      auVar51._8_8_ = 0;
      auVar51._0_8_ = dVar36;
      auVar27 = vsqrtsd_avx(auVar51,auVar51);
      local_1d8.rot.m_data[3] = auVar27._0_8_;
    }
    local_1d8.rot.m_data[0] = local_1d8.rot.m_data[3] * 0.5;
    local_1d8.rot.m_data[3] = 0.5 / local_1d8.rot.m_data[3];
    local_1d8.rot.m_data[1] = (dVar79 - dVar37) * local_1d8.rot.m_data[3];
    local_1d8.rot.m_data[2] = (auVar33._0_8_ - dVar8) * local_1d8.rot.m_data[3];
    local_1d8.rot.m_data[3] = (dVar60 - dVar25) * local_1d8.rot.m_data[3];
    goto LAB_00597187;
  }
  if (local_198 <= (double)local_178._0_8_) {
    if ((double)local_178._0_8_ < (double)local_188._0_8_) goto LAB_00597014;
    dVar36 = (((double)local_178._0_8_ - local_198) - (double)local_188._0_8_) + 1.0;
    if (dVar36 < 0.0) {
      dVar36 = sqrt(dVar36);
    }
    else {
      auVar53._8_8_ = 0;
      auVar53._0_8_ = dVar36;
      auVar27 = vsqrtsd_avx(auVar53,auVar53);
      dVar36 = auVar27._0_8_;
    }
    local_1d8.rot.m_data[1] = dVar36 * 0.5;
    dVar36 = 0.5 / dVar36;
    local_1d8.rot.m_data[0] = dVar79 - dVar37;
    local_1d8.rot.m_data[2] = (dVar60 + dVar25) * dVar36;
    local_1d8.rot.m_data[3] = (dVar8 + auVar33._0_8_) * dVar36;
  }
  else if (local_198 < (double)local_188._0_8_) {
LAB_00597014:
    dVar36 = (((double)local_188._0_8_ - (double)local_178._0_8_) - local_198) + 1.0;
    if (dVar36 < 0.0) {
      dVar36 = sqrt(dVar36);
    }
    else {
      auVar52._8_8_ = 0;
      auVar52._0_8_ = dVar36;
      auVar27 = vsqrtsd_avx(auVar52,auVar52);
      dVar36 = auVar27._0_8_;
    }
    local_1d8.rot.m_data[0] = dVar60 - dVar25;
    local_1d8.rot.m_data[3] = dVar36 * 0.5;
    dVar36 = 0.5 / dVar36;
    local_1d8.rot.m_data[1] = (dVar8 + auVar33._0_8_) * dVar36;
    local_1d8.rot.m_data[2] = (dVar37 + dVar79) * dVar36;
  }
  else {
    dVar36 = ((local_198 - (double)local_188._0_8_) - (double)local_178._0_8_) + 1.0;
    if (dVar36 < 0.0) {
      dVar36 = sqrt(dVar36);
    }
    else {
      auVar50._8_8_ = 0;
      auVar50._0_8_ = dVar36;
      auVar27 = vsqrtsd_avx(auVar50,auVar50);
      dVar36 = auVar27._0_8_;
    }
    local_1d8.rot.m_data[2] = dVar36 * 0.5;
    dVar36 = 0.5 / dVar36;
    local_1d8.rot.m_data[3] = (dVar37 + dVar79) * dVar36;
    local_1d8.rot.m_data[0] = auVar33._0_8_ - dVar8;
    local_1d8.rot.m_data[1] = (dVar60 + dVar25) * dVar36;
  }
  local_1d8.rot.m_data[0] = local_1d8.rot.m_data[0] * dVar36;
LAB_00597187:
  ChMarker::Impose_Abs_Coord
            ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2,&local_1d8);
  dVar36 = (this->belt_up2).m_data[1] - (this->belt_up1).m_data[1];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = (this->belt_up2).m_data[0] - (this->belt_up1).m_data[0];
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar36 * dVar36;
  auVar27 = vfmadd231sd_fma(auVar68,auVar59,auVar59);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = (this->belt_up2).m_data[2] - (this->belt_up1).m_data[2];
  auVar27 = vfmadd231sd_fma(auVar27,auVar54,auVar54);
  auVar27 = vsqrtsd_avx(auVar27,auVar27);
  auVar12._8_8_ = 0x8000000000000000;
  auVar12._0_8_ = 0x8000000000000000;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_1e0 * this->r1 + auVar27._0_8_;
  auVar27 = vxorpd_avx512vl(auVar55,auVar12);
  dVar36 = (double)vmovlpd_avx(auVar27);
  (this->super_ChLinkLockLock).deltaC.pos.m_data[0] = dVar36;
  (this->super_ChLinkLockLock).deltaC.pos.m_data[1] = 0.0;
  (this->super_ChLinkLockLock).deltaC.pos.m_data[2] = 0.0;
  dVar36 = DAT_00b689a0;
  if (this != (ChLinkPulley *)(sBulletDNAstr64 + 0x2848)) {
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[1] = dVar36;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[2] = DAT_00b689a8;
  }
  dVar36 = DAT_00b689a0;
  if (this != (ChLinkPulley *)(sBulletDNAstr64 + 0x2810)) {
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[1] = dVar36;
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[2] = DAT_00b689a8;
  }
  dVar60 = DAT_00b68868;
  dVar35 = DAT_00b68860;
  dVar36 = DAT_00b68858;
  pCVar24 = &(this->super_ChLinkLockLock).deltaC.rot;
  if (pCVar24 != (ChQuaternion<double> *)&QUNIT) {
    pCVar24->m_data[0] = QUNIT;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[1] = dVar36;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[2] = dVar35;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[3] = dVar60;
  }
  dVar60 = DAT_00b68848;
  dVar35 = DAT_00b68840;
  dVar36 = DAT_00b68838;
  pCVar24 = &(this->super_ChLinkLockLock).deltaC_dt.rot;
  if (pCVar24 != (ChQuaternion<double> *)&QNULL) {
    pCVar24->m_data[0] = QNULL;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[1] = dVar36;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[2] = dVar35;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[3] = dVar60;
  }
  dVar60 = DAT_00b68848;
  dVar35 = DAT_00b68840;
  dVar36 = DAT_00b68838;
  pCVar24 = &(this->super_ChLinkLockLock).deltaC_dtdt.rot;
  if (pCVar24 != (ChQuaternion<double> *)&QNULL) {
    pCVar24->m_data[0] = QNULL;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[1] = dVar36;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[2] = dVar35;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[3] = dVar60;
  }
  return;
}

Assistant:

void ChLinkPulley::UpdateTime(double mytime) {
    // First, inherit to parent class
    ChLinkLockLock::UpdateTime(mytime);

    ChFrame<double> abs_shaft1;
    ChFrame<double> abs_shaft2;

    ((ChFrame<double>*)Body1)->TransformLocalToParent(local_shaft1, abs_shaft1);
    ((ChFrame<double>*)Body2)->TransformLocalToParent(local_shaft2, abs_shaft2);

    ChVector<> dcc_w = Vsub(Get_shaft_pos2(), Get_shaft_pos1());

    // compute actual rotation of the two wheels (relative to truss).
    Vector md1 = abs_shaft1.GetA().transpose() * dcc_w;
    md1.z() = 0;
    md1 = Vnorm(md1);
    Vector md2 = abs_shaft2.GetA().transpose() * dcc_w;
    md2.z() = 0;
    md2 = Vnorm(md2);

    double periodic_a1 = ChAtan2(md1.x(), md1.y());
    double periodic_a2 = ChAtan2(md2.x(), md2.y());
    double old_a1 = a1;
    double old_a2 = a2;
    double turns_a1 = floor(old_a1 / CH_C_2PI);
    double turns_a2 = floor(old_a2 / CH_C_2PI);
    double a1U = turns_a1 * CH_C_2PI + periodic_a1 + CH_C_2PI;
    double a1M = turns_a1 * CH_C_2PI + periodic_a1;
    double a1L = turns_a1 * CH_C_2PI + periodic_a1 - CH_C_2PI;
    a1 = a1M;
    if (fabs(a1U - old_a1) < fabs(a1M - old_a1))
        a1 = a1U;
    if (fabs(a1L - a1) < fabs(a1M - a1))
        a1 = a1L;
    double a2U = turns_a2 * CH_C_2PI + periodic_a2 + CH_C_2PI;
    double a2M = turns_a2 * CH_C_2PI + periodic_a2;
    double a2L = turns_a2 * CH_C_2PI + periodic_a2 - CH_C_2PI;
    a2 = a2M;
    if (fabs(a2U - old_a2) < fabs(a2M - old_a2))
        a2 = a2U;
    if (fabs(a2L - a2) < fabs(a2M - a2))
        a2 = a2L;

    // correct marker positions if phasing is not correct
    double m_delta = 0;
    if (checkphase) {
        double realtau = tau;

        m_delta = a1 - phase - (a2 / realtau);

        if (m_delta > CH_C_PI)
            m_delta -= (CH_C_2PI);  // range -180..+180 is better than 0...360
        if (m_delta > (CH_C_PI / 4.0))
            m_delta = (CH_C_PI / 4.0);  // phase correction only in +/- 45�
        if (m_delta < -(CH_C_PI / 4.0))
            m_delta = -(CH_C_PI / 4.0);
        //***TODO***
    }

    // Move markers 1 and 2 to align them as pulley ends

    ChVector<> d21_w = dcc_w - Get_shaft_dir1() * Vdot(Get_shaft_dir1(), dcc_w);
    ChVector<> D21_w = Vnorm(d21_w);

    shaft_dist = d21_w.Length();

    ChVector<> U1_w = Vcross(Get_shaft_dir1(), D21_w);

    double gamma1 = acos((r1 - r2) / shaft_dist);

    ChVector<> Ru_w = D21_w * cos(gamma1) + U1_w * sin(gamma1);
    ChVector<> Rl_w = D21_w * cos(gamma1) - U1_w * sin(gamma1);

    belt_up1 = Get_shaft_pos1() + Ru_w * r1;
    belt_low1 = Get_shaft_pos1() + Rl_w * r1;
    belt_up2 = Get_shaft_pos1() + d21_w + Ru_w * r2;
    belt_low2 = Get_shaft_pos1() + d21_w + Rl_w * r2;

    // marker alignment
    ChVector<> Dxu = Vnorm(belt_up2 - belt_up1);
    ChVector<> Dyu = Ru_w;
    ChVector<> Dzu = Vnorm(Vcross(Dxu, Dyu));
    Dyu = Vnorm(Vcross(Dzu, Dxu));
    ChMatrix33<> maU(Dxu, Dyu, Dzu);

    // ! Require that the BDF routine of marker won't handle speed and acc.calculus of the moved marker 2!
    marker2->SetMotionType(ChMarker::M_MOTION_EXTERNAL);
    marker1->SetMotionType(ChMarker::M_MOTION_EXTERNAL);

    ChCoordsys<> newmarkpos;

    // move marker1 in proper positions
    newmarkpos.pos = this->belt_up1;
    newmarkpos.rot = maU.Get_A_quaternion();
    marker1->Impose_Abs_Coord(newmarkpos);  // move marker1 into teeth position
    // move marker2 in proper positions
    newmarkpos.pos = this->belt_up2;
    newmarkpos.rot = maU.Get_A_quaternion();
    marker2->Impose_Abs_Coord(newmarkpos);  // move marker2 into teeth position

    double phase_correction_up = m_delta * r1;
    double hU = Vlength(belt_up2 - belt_up1) + phase_correction_up;

    // imposed relative positions/speeds
    deltaC.pos = ChVector<>(-hU, 0, 0);
    deltaC_dt.pos = VNULL;
    deltaC_dtdt.pos = VNULL;

    deltaC.rot = QUNIT;  // no relative rotations imposed!
    deltaC_dt.rot = QNULL;
    deltaC_dtdt.rot = QNULL;
}